

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSocket.cpp
# Opt level: O0

int __thiscall
cplus::socket::SocketServer::bind(SocketServer *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint16_t uVar1;
  int iVar2;
  ServerException *this_00;
  undefined4 *__optval;
  sockaddr *__addr_00;
  undefined4 local_28 [2];
  int opt;
  uint16_t local_12;
  SocketServer *pSStack_10;
  uint16_t port_local;
  SocketServer *this_local;
  
  local_12 = (uint16_t)__fd;
  pSStack_10 = this;
  memset(&this->server_addr,0,0x10);
  (this->server_addr).sin_family = 2;
  uVar1 = htons(0);
  (this->server_addr).sin_addr.s_addr = (uint)uVar1;
  uVar1 = htons(local_12);
  (this->server_addr).sin_port = uVar1;
  iVar2 = ::socket(2,1,0);
  this->server_socket = iVar2;
  if (this->server_socket < 0) {
    this_00 = (ServerException *)__cxa_allocate_exception(0x838);
    ServerException::ServerException(this_00,"Create Socket Failed!");
    __cxa_throw(this_00,&ServerException::typeinfo,ServerException::~ServerException);
  }
  local_28[0] = 1;
  iVar2 = 1;
  __optval = local_28;
  setsockopt(this->server_socket,1,2,__optval,4);
  iVar2 = bind(this,iVar2,__addr_00,(socklen_t)__optval);
  return iVar2;
}

Assistant:

int SocketServer::bind(uint16_t port) {
			bzero(&server_addr, sizeof(server_addr)); //把一段内存区的内容全部设置为0
			server_addr.sin_family = AF_INET;
			server_addr.sin_addr.s_addr = htons(INADDR_ANY);
			server_addr.sin_port = htons(port);
			//创建用于internet的流协议(TCP)socket,用server_socket代表服务器socket
			server_socket = ::socket(PF_INET, SOCK_STREAM, 0);
			if (server_socket < 0) {
				throw ServerException("Create Socket Failed!");
			}
			int opt = 1;
			setsockopt(server_socket, SOL_SOCKET, SO_REUSEADDR, &opt, sizeof(opt));
			//把socket和socket地址结构联系起来
			return bind();
		}